

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O2

void anon_unknown.dwarf_2d0ac2::printSpeed
               (int ref_elapsed_time,int elapsed_time,int width,int height)

{
  ostream *poVar1;
  
  *(undefined8 *)(std::operator>> + *(long *)(std::cout + -0x18)) = 2;
  poVar1 = std::operator<<((ostream *)&std::cout,"[          ] ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,width);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,height);
  poVar1 = std::operator<<(poVar1,": C time = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ref_elapsed_time);
  poVar1 = std::operator<<(poVar1," us, SIMD time = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,elapsed_time);
  poVar1 = std::operator<<(poVar1," us");
  std::operator<<(poVar1," (~");
  poVar1 = std::ostream::_M_insert<double>((double)ref_elapsed_time / (double)elapsed_time);
  poVar1 = std::operator<<(poVar1,"x) ");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void printSpeed(int ref_elapsed_time, int elapsed_time, int width,
                       int height) {
  std::cout.precision(2);
  std::cout << "[          ] " << width << "x" << height
            << ": C time = " << ref_elapsed_time
            << " us, SIMD time = " << elapsed_time << " us"
            << " (~" << ref_elapsed_time / (double)elapsed_time << "x) "
            << std::endl;
}